

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int lls_normal(double *A,double *b,int M,int N,double *x)

{
  size_t __size;
  int iVar1;
  double *col;
  double *C;
  double *C_00;
  double *__ptr;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  lVar6 = (long)N;
  col = (double *)malloc(M * lVar6 * 8);
  __size = lVar6 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size * lVar6);
  __ptr = (double *)malloc(__size);
  pdVar2 = (double *)malloc(__size * lVar6);
  mtranspose(A,M,N,col);
  mmult(col,b,C,N,M,1);
  mmult(col,A,C_00,N,M,N);
  iVar1 = chol(C_00,N);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    mtranspose(C_00,N,N,pdVar2);
    *__ptr = *C / *pdVar2;
    pdVar3 = pdVar2;
    for (lVar4 = 1; pdVar3 = pdVar3 + lVar6, lVar4 < lVar6; lVar4 = lVar4 + 1) {
      dVar8 = 0.0;
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        dVar8 = dVar8 + __ptr[lVar7] * pdVar3[lVar7];
      }
      __ptr[lVar4] = (C[lVar4] - dVar8) / pdVar2[lVar4 + (int)lVar4 * N];
    }
    iVar1 = N + -1;
    x[iVar1] = __ptr[iVar1] / C_00[(ulong)(uint)(N * N) - 1];
    uVar5 = (ulong)(N + -2);
    lVar6 = (long)(N + 1);
    pdVar2 = C_00 + uVar5 * lVar6 + 1;
    for (; -1 < (long)uVar5; uVar5 = uVar5 - 1) {
      dVar8 = 0.0;
      for (lVar4 = 0; iVar1 + (int)lVar4 < N; lVar4 = lVar4 + 1) {
        dVar8 = dVar8 + pdVar2[lVar4] * x[(uVar5 & 0xffffffff) + lVar4 + 1];
      }
      x[uVar5] = (__ptr[uVar5] - dVar8) / C_00[uVar5 * lVar6];
      iVar1 = iVar1 + -1;
      pdVar2 = pdVar2 + -lVar6;
    }
    free(col);
    free(C);
    free(C_00);
    free(__ptr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int lls_normal(double *A,double *b,int M,int N,double *x) {
	int retcode,sc,i,j,c1,l;
	double sum;
	double *AT,*d,*C,*y,*CT;
	// M - data points
	// N - Number of parameters
	// A - MXN; b size - M vector; AT - NXM

	AT = (double*) malloc(sizeof(double) * M * N);
	d = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N * N);
	y = (double*) malloc(sizeof(double) * N);
	CT = (double*) malloc(sizeof(double) * N * N);

	retcode = 0;

	mtranspose(A,M,N,AT);
	mmult(AT,b,d,N,M,1);
	mmult(AT,A,C,N,M,N);

	sc = chol(C,N);
	if (sc == -1) {
		return -1;
	}

	mtranspose(C,N,N,CT);
	//Forward Substitution

	y[0] = d[0]/CT[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * CT[c1 + j];
		}
		y[i] = (d[i] - sum)/CT[c1+i];
	}

	//Back Substitution

	x[N - 1] = y[N - 1]/C[N * N - 1];

	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += C[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / C[c1];
	}

	free(AT);
	free(d);
	free(C);
	free(y);
	return retcode;
}